

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIFont::~CGUIFont(CGUIFont *this)

{
  CGUIFont *in_stack_00000010;
  
  ~CGUIFont(in_stack_00000010);
  return;
}

Assistant:

CGUIFont::~CGUIFont()
{
	if (Driver)
		Driver->drop();

	if (SpriteBank) {
		SpriteBank->drop();
		// TODO: spritebank still exists in gui-environment and should be removed here when it's
		// reference-count is 1. Just can't do that from here at the moment.
		// But spritebank would not be able to drop textures anyway because those are in texture-cache
		// where they can't be removed unless materials start reference-couting 'em.
	}
}